

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O0

void __thiscall seq_precede_inc::seq_precede_inc(seq_precede_inc *this,vec<IntVar_*> *_xs)

{
  IntVar *pIVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  IntVar **ppIVar6;
  Tint *this_00;
  undefined8 *in_RDI;
  int mx;
  int ii_1;
  int k;
  int m;
  int ii;
  int M;
  int sz;
  undefined7 in_stack_fffffffffffffe28;
  byte in_stack_fffffffffffffe2f;
  IntVar *in_stack_fffffffffffffe30;
  Tint *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe4c;
  IntVar *in_stack_fffffffffffffe50;
  anon_union_8_2_743a5d44_for_Reason_0 local_58;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  anon_union_8_2_743a5d44_for_Reason_0 local_40;
  uint local_38;
  uint local_34;
  uint local_30;
  Tint local_2c;
  Tint local_28;
  Tint local_24;
  Tint local_20 [8];
  
  Propagator::Propagator((Propagator *)in_stack_fffffffffffffe30);
  *in_RDI = &PTR__seq_precede_inc_0031cbb8;
  vec<IntVar*>::vec<IntVar*>
            ((vec<IntVar_*> *)in_stack_fffffffffffffe50,
             (vec<IntVar_*> *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  vec<IntVar_*>::size((vec<IntVar_*> *)(in_RDI + 3));
  Tint::Tint(local_20,0);
  vec<Tint>::vec((vec<Tint> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                 in_stack_fffffffffffffe40);
  vec<IntVar_*>::size((vec<IntVar_*> *)(in_RDI + 3));
  uVar3 = vec<IntVar_*>::size((vec<IntVar_*> *)(in_RDI + 3));
  Tint::Tint(&local_24,uVar3);
  vec<Tint>::vec((vec<Tint> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                 in_stack_fffffffffffffe40);
  vec<IntVar_*>::size((vec<IntVar_*> *)(in_RDI + 3));
  Tint::Tint(&local_28,0);
  vec<Tint>::vec((vec<Tint> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                 in_stack_fffffffffffffe40);
  vec<IntVar_*>::size((vec<IntVar_*> *)(in_RDI + 3));
  uVar3 = vec<IntVar_*>::size((vec<IntVar_*> *)(in_RDI + 3));
  Tint::Tint(&local_2c,uVar3);
  vec<Tint>::vec((vec<Tint> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                 in_stack_fffffffffffffe40);
  uVar3 = vec<IntVar_*>::size((vec<IntVar_*> *)(in_RDI + 3));
  Tint::Tint((Tint *)(in_RDI + 0xd),uVar3);
  Tint::Tint((Tint *)((long)in_RDI + 0x6c),0);
  vec<int>::vec((vec<int> *)(in_RDI + 0xe));
  vec<int>::vec((vec<int> *)(in_RDI + 0x10));
  local_30 = vec<IntVar_*>::size((vec<IntVar_*> *)(in_RDI + 3));
  *(undefined4 *)((long)in_RDI + 0xc) = 3;
  vec<Tint>::operator[]((vec<Tint> *)(in_RDI + 5),0);
  Tint::operator=((Tint *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  vec<IntVar_*>::size((vec<IntVar_*> *)(in_RDI + 3));
  vec<Tint>::operator[]((vec<Tint> *)(in_RDI + 7),0);
  Tint::operator=((Tint *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  local_34 = 1;
  local_38 = 0;
  do {
    if ((int)local_30 <= (int)local_38) {
      Tint::operator=((Tint *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      local_44 = 0;
      local_48 = 0;
      local_4c = local_30;
      do {
        do {
          do {
            local_4c = local_4c - 1;
            if ((int)local_4c < 0) {
              Tint::operator=((Tint *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
              return;
            }
            vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 3),local_4c);
            local_50 = IntVar::getMin((IntVar *)0x1e0b0f);
            if (((int)local_48 < (int)local_50) &&
               (local_48 = local_50, (int)local_44 < (int)local_50)) {
              local_44 = local_50;
            }
          } while (local_48 == 0);
          vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 3),local_4c);
          bVar2 = IntVar::indomain(in_stack_fffffffffffffe50,
                                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        } while (!bVar2);
        vec<Tint>::operator[]((vec<Tint> *)(in_RDI + 7),local_48);
        Tint::operator=((Tint *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        vec<Tint>::operator[]((vec<Tint> *)(in_RDI + 0xb),local_4c);
        Tint::operator=((Tint *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        this_00 = vec<Tint>::operator[]((vec<Tint> *)(in_RDI + 5),local_48);
        uVar3 = Tint::operator_cast_to_int(this_00);
        if (uVar3 == local_4c) {
          in_stack_fffffffffffffe50 =
               (IntVar *)vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 3),local_4c);
          bVar2 = IntVar::setMinNotR(in_stack_fffffffffffffe30,
                                     CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
          in_stack_fffffffffffffe4c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe4c);
          if (bVar2) {
            ppIVar6 = vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 3),local_4c);
            in_stack_fffffffffffffe30 = *ppIVar6;
            lVar5 = (long)(int)local_48;
            Reason::Reason((Reason *)&local_58,(Clause *)0x0);
            iVar4 = (*(in_stack_fffffffffffffe30->super_Var).super_Branching._vptr_Branching[0xe])
                              (in_stack_fffffffffffffe30,lVar5,local_58._pt,1);
            in_stack_fffffffffffffe2f = (byte)iVar4;
            if (((in_stack_fffffffffffffe2f ^ 0xff) & 1) != 0) {
              printf("=====UNSATISFIABLE=====\n");
              printf("%% Top level failure!\n");
              exit(0);
            }
          }
        }
        local_48 = local_48 - 1;
      } while( true );
    }
    vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 3),local_38);
    bVar2 = IntVar::setMaxNotR(in_stack_fffffffffffffe30,
                               CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    if (bVar2) {
      ppIVar6 = vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 3),local_38);
      pIVar1 = *ppIVar6;
      lVar5 = (long)(int)local_34;
      Reason::Reason((Reason *)&local_40,(Clause *)0x0);
      iVar4 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])
                        (pIVar1,lVar5,local_40._pt,1);
      if ((((byte)iVar4 ^ 0xff) & 1) != 0) {
        printf("=====UNSATISFIABLE=====\n");
        printf("%% Top level failure!\n");
        exit(0);
      }
    }
    vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 3),local_38);
    bVar2 = IntVar::indomain(in_stack_fffffffffffffe50,
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if (bVar2) {
      vec<Tint>::operator[]((vec<Tint> *)(in_RDI + 5),local_34);
      Tint::operator=((Tint *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      vec<Tint>::operator[]((vec<Tint> *)(in_RDI + 9),local_38);
      Tint::operator=((Tint *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      local_34 = local_34 + 1;
    }
    ppIVar6 = vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 3),local_38);
    (*((*ppIVar6)->super_Var).super_Branching._vptr_Branching[7])(*ppIVar6,in_RDI,(ulong)local_38,1)
    ;
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

seq_precede_inc(vec<IntVar*>& _xs)
			: xs(_xs),
				first(xs.size() + 1, 0),
				limit(xs.size() + 1, xs.size()),
				first_val(xs.size(), 0),
				limit_val(xs.size(), xs.size()),
				max_val(xs.size()),
				max_def(0) {
		const int sz = xs.size();
		priority = 3;

		// Set unused zero value out of range
		first[0] = -1;
		limit[0] = xs.size() + 1;

		int M = 1;
		// Initialize firsts.
		for (int ii = 0; ii < sz; ii++) {
			if (xs[ii]->setMaxNotR(M)) {
				if (!xs[ii]->setMax(M)) {
					TL_FAIL();
				}
			}
			if (xs[ii]->indomain(M)) {
				first[M] = ii;
				first_val[ii] = M;
				++M;
			}
			xs[ii]->attach(this, ii, EVENT_C);
		}
		max_val = M - 1;

		// check_firsts();

		// Initialize lasts.
		int m = 0;
		int k = 0;
		for (int ii = sz - 1; ii >= 0; --ii) {
			const int mx = xs[ii]->getMin();
			if (mx > k) {
				k = mx;
				if (mx > m) {
					m = mx;
				}
			}
			if ((k != 0) && xs[ii]->indomain(k)) {
				limit[k] = ii;
				limit_val[ii] = k;
				// Definite occurrence
				if (first[k] == ii && xs[ii]->setMinNotR(k)) {
					if (!xs[ii]->setMin(k)) {
						TL_FAIL();
					}
				}
				--k;
			}
		}
		max_def = m;
	}